

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O1

void NULLC::TraceLeave(double ts,uint eventPos,uint labelPos)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  
  lVar3 = traceContext;
  if (*(int *)(traceContext + 0x270) == *(int *)(traceContext + 0x274)) {
    TraceDump();
  }
  uVar4 = NULLCTime::clockMicro();
  if (eventPos < *(uint *)(lVar3 + 0x270)) {
    uVar1 = *(uint *)(*(long *)(lVar3 + 0x278) + 4 + (ulong)eventPos * 8);
    dVar6 = (double)uVar1;
    if ((dVar6 == ts) && (!NAN(dVar6) && !NAN(ts))) {
      if (*(uint *)(lVar3 + 0x260) < labelPos) {
        __assert_fail("context.labels.count >= labelPos",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                      ,0xfc,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
      }
      if ((*(byte *)(*(long *)(lVar3 + 0x278) + (ulong)eventPos * 8) & 1) == 0) {
        __assert_fail("enterEvent.isEnter",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                      ,0xfd,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
      }
      if (uVar4 - uVar1 < 0x32) {
        *(uint *)(lVar3 + 0x270) = eventPos;
        *(uint *)(lVar3 + 0x260) = labelPos;
        iVar5 = *(int *)(lVar3 + 0x244);
        if (iVar5 == 0) {
          __assert_fail("context.depth != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                        ,0x104,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
        }
        goto LAB_0018788f;
      }
    }
  }
  lVar2 = *(long *)(lVar3 + 0x278);
  uVar1 = *(uint *)(lVar3 + 0x270);
  *(uint *)(lVar3 + 0x270) = uVar1 + 1;
  *(undefined4 *)(lVar2 + (ulong)uVar1 * 8) = 0;
  *(uint *)(lVar2 + 4 + (ulong)uVar1 * 8) = uVar4;
  iVar5 = *(int *)(lVar3 + 0x244);
  if (iVar5 == 0) {
    __assert_fail("context.depth != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/../NULLC/Trace.h"
                  ,0x112,"void NULLC::TraceLeave(double, unsigned int, unsigned int)");
  }
LAB_0018788f:
  *(int *)(lVar3 + 0x244) = iVar5 + -1;
  return;
}

Assistant:

inline void TraceLeave(double ts, unsigned eventPos, unsigned labelPos)
	{
		TraceContext &context = *traceContext;

		if(context.events.count == context.events.max)
			TraceDump();

		unsigned currTs = NULLCTime::clockMicro();

		if(context.events.count > eventPos && context.events.data[eventPos].ts == ts)
		{
			TraceEvent &enterEvent = context.events.data[eventPos];

			assert(context.labels.count >= labelPos);
			assert(enterEvent.isEnter);

			if(currTs - enterEvent.ts < 50)
			{
				context.events.count = eventPos;
				context.labels.count = labelPos;

				assert(context.depth != 0);
				context.depth--;

				return;
			}
		}

		TraceEvent &traceEvent = context.events.data[context.events.count++];

		traceEvent.isEnter = false;
		traceEvent.isLabel = false;
		traceEvent.token = 0;
		traceEvent.ts = currTs;

		assert(context.depth != 0);
		context.depth--;
	}